

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void v_scroll_indicator_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  am_rect arrow_rect;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  int iVar7;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 uVar8;
  undefined4 uVar10;
  ulong uVar9;
  undefined4 uVar11;
  int local_7c;
  int y;
  undefined1 auStack_64 [8];
  am_rect r;
  Am_Widget_Look local_44;
  Computed_Colors_Record CStack_40;
  Am_Widget_Look look;
  Computed_Colors_Record color_rec;
  bool active;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *draw_local;
  Am_Object *self_local;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  pAVar6 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  iVar2 = iVar2 + x_offset;
  pAVar6 = Am_Object::Get(self,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  iVar3 = iVar3 + y_offset;
  pAVar6 = Am_Object::Get(self,0x66,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x67,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0xcc,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = Am_Object::Get(self,0x1ad,0);
  Computed_Colors_Record::Computed_Colors_Record(&stack0xffffffffffffffc0,pAVar6);
  pAVar6 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_44,pAVar6);
  if (local_44.value == Am_MOTIF_LOOK_val) {
    Am_Draw_Motif_Box(iVar2,iVar3,iVar4,iVar5,false,&stack0xffffffffffffffc0,draw);
  }
  else if (local_44.value == Am_WINDOWS_LOOK_val) {
    am_rect::am_rect((am_rect *)auStack_64,iVar2,iVar3,iVar4,iVar5);
    arrow_rect.width = r.left;
    arrow_rect.height = r.top;
    arrow_rect.left = auStack_64._0_4_;
    arrow_rect.top = auStack_64._4_4_;
    draw_win_arrow_box(arrow_rect,false,false,&stack0xffffffffffffffc0,draw);
  }
  else {
    if (local_44.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if (bVar1) {
      uVar8 = CONCAT44(uVar10,0xf);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&(CStack_40.data)->highlight_style,&(CStack_40.data)->background_style,
                 (ulong)(iVar2 + 1),(ulong)(iVar3 + 1),0xe,uVar8,0);
      iVar5 = iVar2 + 1;
      iVar7 = iVar3 + 0xf;
      uVar10 = (undefined4)((ulong)uVar8 >> 0x20);
      uVar11 = 0;
      iVar4 = iVar7;
      (*draw->_vptr_Am_Drawonable[0x2b])(draw,&(CStack_40.data)->shadow_style,&Am_No_Style);
      uVar9 = CONCAT44(uVar10,9);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&(CStack_40.data)->highlight_style,(ulong)(iVar2 + 5),
                 (ulong)(iVar3 + 4),6,uVar9,0,iVar7,iVar5,iVar4,uVar11);
      for (local_7c = 5; local_7c < 0xc; local_7c = local_7c + 2) {
        uVar9 = uVar9 & 0xffffffff00000000;
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&(CStack_40.data)->background_style,(ulong)(iVar2 + 5),
                   (ulong)(uint)(iVar3 + local_7c),(ulong)(iVar2 + 10),
                   (ulong)(uint)(iVar3 + local_7c),uVar9);
      }
    }
  }
  Computed_Colors_Record::~Computed_Colors_Record(&stack0xffffffffffffffc0);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, v_scroll_indicator_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    Am_Draw_Motif_Box(left, top, width, height, false, color_rec, draw);
    break;

  case Am_WINDOWS_LOOK_val: {
    am_rect r(left, top, width, height);
    draw_win_arrow_box(r, false, false, color_rec, draw);
  } break;

  case Am_MACINTOSH_LOOK_val:
    if (active) {
      draw->Draw_Rectangle(color_rec.data->highlight_style,
                           color_rec.data->background_style, left + 1, top + 1,
                           14, 15);
      draw->Draw_3_Lines(color_rec.data->shadow_style, Am_No_Style, left + 1,
                         top, left + 14, top, left + 14, top + 15, left + 1,
                         top + 15);
      draw->Draw_Rectangle(Am_No_Style, color_rec.data->highlight_style,
                           left + 5, top + 4, 6, 9);
      for (int y = 5; y <= 11; y += 2)
        draw->Draw_Line(color_rec.data->background_style, left + 5, top + y,
                        left + 10, top + y);
    }
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}